

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senone.c
# Opt level: O2

senone_t * senone_init(logmath_t *logmath,char *mixwfile,char *sen2mgau_map,float64 mixwfloor)

{
  uint32 **buf;
  uint uVar1;
  uint32 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int32 iVar6;
  senone_t *psVar7;
  FILE *pFVar8;
  size_t sVar9;
  mgau2sen_t *pmVar10;
  uint32 *puVar11;
  void *pvVar12;
  mixw_t *pmVar13;
  senprob_t **ppsVar14;
  float32 *vec;
  uint32 uVar15;
  char *pcVar16;
  char *fmt;
  mixw_t *pmVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  senprob_t ***pppsVar21;
  ulong uVar22;
  long lVar23;
  long lStackY_d0;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 uVar24;
  int32 n_cw;
  int32 byteswap;
  uint32 chksum;
  char *local_98;
  char *local_90;
  char **argval;
  uint32 *local_80;
  int local_78;
  undefined1 local_71;
  senone_t *local_70;
  FILE *local_68;
  char **argname;
  char eofchk;
  float64 local_50;
  FILE *local_48;
  mixw_t *local_40;
  ulong local_38;
  undefined4 uVar25;
  
  local_50 = mixwfloor;
  psVar7 = (senone_t *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                          ,0x154);
  psVar7->n_sen = 0;
  psVar7->sen2mgau = (uint32 *)0x0;
  if (sen2mgau_map == (char *)0x0) {
    __assert_fail("sen2mgau_map",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,0x158,"senone_t *senone_init(logmath_t *, const char *, const char *, float64)");
  }
  iVar5 = strcmp(sen2mgau_map,".semi.");
  local_90 = mixwfile;
  local_70 = psVar7;
  if (iVar5 == 0) {
    psVar7->n_mgau = 1;
LAB_001030da:
    if (mixwfile == (char *)0x0) {
      __assert_fail("mixwfile",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,0x165,"senone_t *senone_init(logmath_t *, const char *, const char *, float64)"
                   );
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0xd2,"Reading senone mixture weights: %s\n",mixwfile);
    pFVar8 = fopen(mixwfile,"rb");
    if (pFVar8 == (FILE *)0x0) {
      lVar23 = 0xd5;
LAB_001039f3:
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                     ,lVar23,"fopen(%s,rb) failed\n",mixwfile);
      goto LAB_001037ba;
    }
    local_48 = pFVar8;
    iVar6 = bio_readhdr((FILE *)pFVar8,&argname,&argval,&byteswap);
    if (iVar6 < 0) {
      pcVar16 = "bio_readhdr(%s) failed\n";
      lStackY_d0 = 0xd9;
      sen2mgau_map = local_90;
    }
    else {
      local_78 = 0;
      for (lVar23 = 0; pcVar16 = *(char **)((long)argname + lVar23), pcVar16 != (char *)0x0;
          lVar23 = lVar23 + 8) {
        iVar5 = strcmp(pcVar16,"version");
        if (iVar5 == 0) {
          pcVar16 = *(char **)((long)argval + lVar23);
          iVar5 = strcmp(pcVar16,"1.0");
          if (iVar5 != 0) {
            in_stack_ffffffffffffff38 = 0;
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,0xe1,"Version mismatch(%s): %s, expecting %s\n",local_90,pcVar16,"1.0");
          }
        }
        else {
          iVar5 = strcmp(pcVar16,"chksum0");
          if (iVar5 == 0) {
            local_78 = 1;
          }
        }
      }
      bio_hdrarg_free(argname,argval);
      pFVar8 = local_48;
      psVar7 = local_70;
      argval = (char **)0x0;
      argname = (char **)0x0;
      chksum = 0;
      uVar1 = local_70->n_sen;
      iVar6 = bio_fread(local_70,4,1,(FILE *)local_48,byteswap,&chksum);
      if (iVar6 == 1) {
        local_80 = &psVar7->n_feat;
        iVar6 = bio_fread(local_80,4,1,(FILE *)pFVar8,byteswap,&chksum);
        if (((iVar6 == 1) &&
            (iVar6 = bio_fread(&n_cw,4,1,(FILE *)pFVar8,byteswap,&chksum), iVar6 == 1)) &&
           (iVar6 = bio_fread(&eofchk,4,1,(FILE *)pFVar8,byteswap,&chksum), iVar6 == 1)) {
          uVar18 = psVar7->n_sen;
          uVar20 = uVar18;
          if ((uVar1 != 0) && (uVar20 = uVar1, uVar18 != uVar1)) {
            pcVar16 = "#senones(%d) conflict with mapping file(%d)\n";
            lVar23 = 0xf4;
            uVar19 = (ulong)uVar18;
LAB_001037fa:
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,lVar23,pcVar16,uVar19,(ulong)uVar1);
            goto LAB_001037ba;
          }
          uVar22 = (ulong)uVar20;
          if (0x7ffe < uVar20) {
            uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
            lVar23 = 0xf6;
            pcVar16 = local_90;
LAB_00103a55:
            uVar24 = CONCAT44(uVar25,0x7fff);
            fmt = "%s: #senones (%d) exceeds limit (%d)\n";
            goto LAB_00103a7c;
          }
          if (*local_80 == 0) {
            pcVar16 = "Bad #features: %d\n";
            lVar23 = 0xf8;
            uVar19 = 0;
          }
          else {
            uVar19 = (ulong)(uint)n_cw;
            if (0 < n_cw) {
              uVar18 = psVar7->n_mgau;
              if (psVar7->sen2mgau == (uint32 *)0x0) {
                if (1 < uVar18) {
                  __assert_fail("(s->n_mgau == 0) || (s->n_mgau == 1)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                ,0xfe,
                                "int32 senone_mixw_read(logmath_t *, senone_t *, const char *, float64)"
                               );
                }
                puVar11 = (uint32 *)
                          __ckd_calloc__(uVar22,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                         ,0x100);
                psVar7->sen2mgau = puVar11;
                if (psVar7->n_mgau == 1) {
                  for (uVar19 = 0; uVar20 = psVar7->n_sen, uVar19 < uVar20; uVar19 = uVar19 + 1) {
                    puVar11[uVar19] = 0;
                  }
                }
                else {
                  uVar20 = psVar7->n_sen;
                  psVar7->n_mgau = uVar20;
                  for (uVar19 = 0; uVar19 < uVar20; uVar19 = uVar19 + 1) {
                    puVar11[uVar19] = (uint32)uVar19;
                    uVar20 = psVar7->n_sen;
                  }
                }
                uVar18 = psVar7->n_mgau;
              }
              else if (uVar18 == 0) {
                __assert_fail("s->n_mgau != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                              ,0x10d,
                              "int32 senone_mixw_read(logmath_t *, senone_t *, const char *, float64)"
                             );
              }
              uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
              pcVar16 = local_90;
              if (0x7ffe < uVar18) {
                lVar23 = 0x10f;
                goto LAB_00103a79;
              }
              local_98 = (char *)CONCAT44(local_98._4_4_,n_cw);
              if (_eofchk != *local_80 * uVar20 * n_cw) {
                uVar24 = CONCAT44(uVar25,uVar20);
                fmt = "%s: #float32 values(%d) doesn\'t match dimensions: %d x %d x %d\n";
                lVar23 = 0x113;
                uVar22 = (ulong)_eofchk;
                goto LAB_00103a7c;
              }
              if (((double)local_50 <= 0.0) || (1.0 <= (double)local_50)) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                        ,0x11b,"mixwfloor (%e) not in range (0, 1)\n");
                goto LAB_001037ba;
              }
              local_68 = (FILE *)(long)n_cw;
              pmVar10 = (mgau2sen_t *)
                        __ckd_calloc__((ulong)uVar18,0x18,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                       ,0xa2);
              psVar7->mgau2sen = pmVar10;
              puVar11 = (uint32 *)
                        __ckd_calloc__((ulong)psVar7->n_sen,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                       ,0xa3);
              psVar7->mgau2sen_idx = puVar11;
              uVar18 = psVar7->n_sen;
              for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                uVar1 = psVar7->sen2mgau[uVar19];
                if (((long)(int)uVar1 < 0) || (psVar7->n_mgau <= uVar1)) {
                  __assert_fail("(m < s->n_mgau) && (m >= 0)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                ,0xa6,"void build_mgau2sen(senone_t *, int32)");
                }
                psVar7->mgau2sen[(int)uVar1].n_sen = psVar7->mgau2sen[(int)uVar1].n_sen + 1;
              }
              pvVar12 = __ckd_calloc__((ulong)uVar18,2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                       ,0xaa);
              uVar18 = psVar7->n_mgau;
              for (lVar23 = 0; (ulong)uVar18 * 0x18 - lVar23 != 0; lVar23 = lVar23 + 0x18) {
                pmVar10 = psVar7->mgau2sen;
                *(void **)((long)&pmVar10->sen + lVar23) = pvVar12;
                pvVar12 = (void *)((long)pvVar12 +
                                  (long)*(int *)((long)&pmVar10->n_sen + lVar23) * 2);
                *(undefined4 *)((long)&pmVar10->n_sen + lVar23) = 0;
              }
              for (uVar19 = 0; uVar19 < psVar7->n_sen; uVar19 = uVar19 + 1) {
                pmVar10 = psVar7->mgau2sen;
                uVar15 = psVar7->sen2mgau[uVar19];
                uVar2 = pmVar10[(int)uVar15].n_sen;
                pmVar10[(int)uVar15].sen[(int)uVar2] = (s3senid_t)uVar19;
                psVar7->mgau2sen_idx[uVar19] = uVar2;
                pmVar10[(int)uVar15].n_sen = uVar2 + 1;
              }
              pmVar17 = (mixw_t *)0x0;
              while (pmVar17 < (mixw_t *)(ulong)psVar7->n_mgau) {
                pmVar13 = (mixw_t *)
                          __ckd_calloc__((ulong)psVar7->n_feat,0x10,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                         ,0xbb);
                psVar7->mgau2sen[(long)pmVar17].feat_mixw = pmVar13;
                pppsVar21 = &pmVar13->prob;
                local_40 = pmVar17;
                for (uVar19 = 0; uVar19 < *local_80; uVar19 = uVar19 + 1) {
                  ((mixw_t *)(pppsVar21 + -1))->n_wt = (int32)local_98;
                  ppsVar14 = (senprob_t **)
                             __ckd_calloc_2d__((long)local_70->mgau2sen[(long)pmVar17].n_sen,
                                               (size_t)local_68,1,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                               ,0xc1);
                  *pppsVar21 = ppsVar14;
                  pppsVar21 = pppsVar21 + 2;
                }
                psVar7 = local_70;
                pmVar17 = (mixw_t *)((long)&local_40->n_wt + 1);
              }
              vec = (float32 *)
                    __ckd_calloc__((long)n_cw,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                   ,0x121);
              local_50 = (float64)CONCAT44(local_50._4_4_,(float)(double)local_50);
              uVar18 = 0;
              uVar19 = 0;
              pFVar8 = local_48;
              while (uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                    uVar19 < psVar7->n_sen) {
                uVar15 = psVar7->mgau2sen_idx[uVar19];
                local_40 = psVar7->mgau2sen[(int)psVar7->sen2mgau[uVar19]].feat_mixw;
                local_38 = uVar19;
                for (uVar22 = 0; uVar22 < *local_80; uVar22 = uVar22 + 1) {
                  iVar6 = bio_fread(vec,4,n_cw,(FILE *)pFVar8,byteswap,&chksum);
                  if (iVar6 != n_cw) {
                    pcVar16 = "bio_fread(%s) (arraydata) failed\n";
                    lStackY_d0 = 0x12d;
                    sen2mgau_map = local_90;
                    goto LAB_001037b3;
                  }
                  local_98 = (char *)CONCAT44(local_98._4_4_,uVar18);
                  local_68 = (FILE *)vector_sum_norm(vec,iVar6);
                  vector_floor((vector_t)vec,n_cw,local_50._0_4_);
                  vector_sum_norm(vec,n_cw);
                  pmVar17 = local_40 + uVar22;
                  for (lVar23 = 0; lVar23 < n_cw; lVar23 = lVar23 + 1) {
                    iVar5 = logmath_log(logmath,(float64)(double)(float)vec[lVar23]);
                    pmVar17->prob[(int)uVar15][lVar23] = -(char)iVar5;
                  }
                  uVar18 = (int32)local_98 + (uint)((double)local_68 == 0.0);
                  pFVar8 = local_48;
                }
                psVar7 = local_70;
                uVar19 = local_38 + 1;
              }
              if (0 < (int)uVar18) {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                        ,0x13e,"Weight normalization failed for %d senones\n",(ulong)uVar18);
              }
              ckd_free(vec);
              if (local_78 != 0) {
                bio_verify_chksum((FILE *)pFVar8,byteswap,chksum);
              }
              sVar9 = fread(&local_71,1,1,pFVar8);
              if (sVar9 != 1) {
                fclose(pFVar8);
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                        ,0x14b,"Read mixture weights for %d senones: %d features x %d codewords\n",
                        (ulong)psVar7->n_sen,(ulong)psVar7->n_feat,CONCAT44(uVar25,n_cw));
                return psVar7;
              }
              pcVar16 = "More data than expected in %s\n";
              lStackY_d0 = 0x146;
              sen2mgau_map = local_90;
              goto LAB_001037b3;
            }
            pcVar16 = "Bad #mixing-wts/senone: %d\n";
            lVar23 = 0xfa;
          }
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,lVar23,pcVar16,uVar19);
          goto LAB_001037ba;
        }
      }
      pcVar16 = "bio_fread(%s) (arraysize) failed\n";
      lStackY_d0 = 0xf1;
      sen2mgau_map = local_90;
    }
  }
  else {
    iVar5 = strcmp(sen2mgau_map,".cont.");
    if (iVar5 == 0) {
      psVar7->n_mgau = 0;
      goto LAB_001030da;
    }
    local_80 = (uint32 *)CONCAT44(local_80._4_4_,1);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x4a,"Reading senone-codebook map file: %s\n",sen2mgau_map);
    pFVar8 = fopen(sen2mgau_map,"rb");
    if (pFVar8 == (FILE *)0x0) {
      lVar23 = 0x4d;
      mixwfile = sen2mgau_map;
      goto LAB_001039f3;
    }
    iVar6 = bio_readhdr((FILE *)pFVar8,&argname,&argval,&byteswap);
    if (-1 < iVar6) {
      buf = &psVar7->sen2mgau;
      bVar4 = false;
      bVar3 = false;
      local_98 = sen2mgau_map;
      local_68 = pFVar8;
      for (lVar23 = 0; pcVar16 = *(char **)((long)argname + lVar23), pcVar16 != (char *)0x0;
          lVar23 = lVar23 + 8) {
        iVar5 = strcmp(pcVar16,"version");
        if (iVar5 == 0) {
          pcVar16 = *(char **)((long)argval + lVar23);
          iVar5 = strcmp(pcVar16,"1.2");
          if (iVar5 != 0) {
            in_stack_ffffffffffffff38 = 0;
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,0x5a,"Version mismatch(%s): %s, expecting %s\n",local_98,pcVar16,"1.2");
            pcVar16 = *(char **)((long)argval + lVar23);
          }
          iVar5 = __isoc99_sscanf(pcVar16,"%f",&n_cw);
          if (iVar5 != 1) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,0x5f,"%s: Bad version no. string: %s\n",local_98,
                    *(undefined8 *)((long)argval + lVar23));
            goto LAB_001037ba;
          }
          bVar3 = 1.1 < (float)n_cw;
        }
        else {
          iVar5 = strcmp(pcVar16,"chksum0");
          if (iVar5 == 0) {
            bVar4 = true;
          }
        }
      }
      bio_hdrarg_free(argname,argval);
      pFVar8 = local_68;
      psVar7 = local_70;
      argval = (char **)0x0;
      argname = (char **)0x0;
      chksum = 0;
      if ((bVar3) &&
         (iVar6 = bio_fread(&local_70->n_mgau,4,1,(FILE *)local_68,byteswap,&chksum), iVar6 != 1)) {
        pcVar16 = "fread(%s) (#gauden) failed\n";
        lStackY_d0 = 0x6e;
        sen2mgau_map = local_98;
        goto LAB_001037b3;
      }
      iVar6 = bio_fread_1d(buf,4,&psVar7->n_sen,(FILE *)pFVar8,byteswap,&chksum);
      if (iVar6 < 0) {
        pcVar16 = "bio_fread_1d(%s) failed\n";
        lStackY_d0 = 0x74;
        sen2mgau_map = local_98;
        goto LAB_001037b3;
      }
      if (bVar3) {
        uVar22 = (ulong)psVar7->n_sen;
      }
      else {
        psVar7->n_mgau = 1;
        uVar22 = (ulong)psVar7->n_sen;
        for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
          if ((uint)local_80 <= (*buf)[uVar19]) {
            uVar15 = (*buf)[uVar19] + 1;
            psVar7->n_mgau = uVar15;
            local_80 = (uint32 *)CONCAT44(local_80._4_4_,uVar15);
          }
        }
      }
      uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      pcVar16 = local_98;
      if (0x7ffe < (uint)uVar22) {
        lVar23 = 0x81;
        goto LAB_00103a55;
      }
      uVar18 = psVar7->n_mgau;
      if (uVar18 < 0x7fff) {
        for (uVar19 = 0; uVar22 != uVar19; uVar19 = uVar19 + 1) {
          uVar1 = (*buf)[uVar19];
          if (uVar18 <= uVar1) {
            pcVar16 = "Bad sen2mgau[%d]= %d, out of range [0, %d)\n";
            lVar23 = 0x89;
            goto LAB_001037fa;
          }
        }
        if (bVar4) {
          bio_verify_chksum((FILE *)pFVar8,byteswap,chksum);
        }
        sVar9 = fread(&eofchk,1,1,pFVar8);
        mixwfile = local_90;
        if (sVar9 != 1) {
          fclose(pFVar8);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,0x94,"Read %d->%d senone-codebook mappings\n",(ulong)psVar7->n_sen,
                  (ulong)psVar7->n_mgau);
          goto LAB_001030da;
        }
        pcVar16 = "More data than expected in %s\n";
        lStackY_d0 = 0x90;
        sen2mgau_map = local_98;
        goto LAB_001037b3;
      }
      lVar23 = 0x83;
LAB_00103a79:
      uVar24 = CONCAT44(uVar25,0x7fff);
      fmt = "%s: #gauden (%d) exceeds limit (%d)\n";
      uVar22 = (ulong)uVar18;
LAB_00103a7c:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
              ,lVar23,fmt,pcVar16,uVar22,uVar24);
      goto LAB_001037ba;
    }
    pcVar16 = "bio_readhdr(%s) failed\n";
    lStackY_d0 = 0x51;
  }
LAB_001037b3:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
          ,lStackY_d0,pcVar16,sen2mgau_map);
LAB_001037ba:
  exit(1);
}

Assistant:

senone_t *senone_init (logmath_t *logmath, const char *mixwfile, const char *sen2mgau_map, float64 mixwfloor)
{
    senone_t *s;
    
    s = (senone_t *) ckd_calloc (1, sizeof(senone_t));
    s->n_sen = 0;	/* As yet unknown */
    s->sen2mgau = NULL;

    assert (sen2mgau_map);

    if (strcmp (sen2mgau_map, ".semi.") == 0) {
	/* Not a file; map all senones to a single parent mgau */
	s->n_mgau = 1;	/* But we don't yet know the #senones */
    } else if (strcmp (sen2mgau_map, ".cont.") == 0) {
	/* Not a file; map each senone to its own distinct parent mgau */
	s->n_mgau = 0;	/* We don't yet know the #senones */
    } else {
	/* Read mapping file */
	senone_mgau_map_read (s, sen2mgau_map);	/* Fills in n_sen */
    }
    
    assert (mixwfile);
    senone_mixw_read (logmath, s, mixwfile, mixwfloor);
    
    return s;
}